

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  char *__s;
  undefined8 __s_00;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  string *psVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *local_260;
  allocator<char> local_251;
  string local_250;
  cmValue local_230;
  cmValue noPackageAll;
  allocator<char> local_219;
  value_type local_218;
  allocator<char> local_1f1;
  value_type local_1f0;
  allocator<char> local_1c9;
  value_type local_1c8;
  allocator<char> local_1a1;
  value_type local_1a0;
  undefined1 local_180 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  char *cmakeCfgIntDir;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  const_iterator local_70;
  char **target;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  undefined1 local_40 [8];
  string configFile;
  value_type *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  configFile.field_2._8_8_ =
       std::
       vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
       ::operator[](&this->Makefiles,0);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                      configFile.field_2._8_8_);
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            ((string *)local_40,psVar4,(char (*) [19])0x103f97b);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
  if (bVar1) {
    __begin1 = (const_iterator)&AddGlobalTarget_Package::reservedTargets;
    __end1 = std::initializer_list<const_char_*>::begin(&AddGlobalTarget_Package::reservedTargets);
    target = std::initializer_list<const_char_*>::end(&AddGlobalTarget_Package::reservedTargets);
    for (; __end1 != target; __end1 = __end1 + 1) {
      local_70 = __end1;
      __s = *__end1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"when CPack packaging is enabled",
                 (allocator<char> *)((long)&cmakeCfgIntDir + 7));
      bVar1 = CheckCMP0037(this,&local_90,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeCfgIntDir + 7));
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        __range1._0_4_ = 1;
        goto LAB_008ed334;
      }
    }
    gti._152_4_ = (*this->_vptr_cmGlobalGenerator[0x17])();
    gti._156_4_ = extraout_var;
    GlobalTargetInfo::GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x21])();
    std::__cxx11::string::operator=
              ((string *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::operator=
              ((string *)(gti.Name.field_2._M_local_buf + 8),"Run CPack packaging tool...");
    gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
    pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                        configFile.field_2._8_8_);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
    std::__cxx11::string::operator=
              ((string *)
               &gti.Depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar4);
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_180);
    psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,psVar4);
    bVar1 = cmNonempty((char *)gti._152_8_);
    if ((bVar1) && (*(char *)gti._152_8_ != '.')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"-C",&local_1a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_180,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      __s_00 = gti._152_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,(char *)__s_00,&local_1c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_180,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"--config",&local_1f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"./CPackConfig.cmake",&local_219);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               ((long)&gti.Message.field_2 + 8),(value_type *)local_180);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x1f])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                          configFile.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_251);
      local_230 = cmMakefile::GetDefinition(pcVar3,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      bVar1 = cmValue::IsOff(&local_230);
      if (bVar1) {
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x1b])();
        local_260 = (char *)CONCAT44(extraout_var_03,iVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_260);
      }
    }
    else {
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1f])();
      noPackageAll.Value = (string *)CONCAT44(extraout_var_02,iVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &gti.CommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&noPackageAll);
    }
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)
                        &singleLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_180);
    GlobalTargetInfo::~GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __range1._0_4_ = 0;
  }
  else {
    __range1._0_4_ = 1;
  }
LAB_008ed334:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package", "PACKAGE" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CPack packaging is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  singleLine.push_back("./CPackConfig.cmake");
  gti.CommandLines.push_back(std::move(singleLine));
  if (this->GetPreinstallTargetName()) {
    gti.Depends.emplace_back(this->GetPreinstallTargetName());
  } else {
    cmValue noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (noPackageAll.IsOff()) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  targets.push_back(std::move(gti));
}